

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.cpp
# Opt level: O1

Rule * __thiscall EOPlus::Context::GetGoal(Context *this)

{
  State *pSVar1;
  _Elt_pointer pRVar2;
  difference_type __node_offset;
  long lVar3;
  
  pSVar1 = this->state;
  if ((pSVar1 != (State *)0x0) &&
     (pRVar2 = (pSVar1->rules).super__Deque_base<EOPlus::Rule,_std::allocator<EOPlus::Rule>_>.
               _M_impl.super__Deque_impl_data._M_start._M_cur,
     (pSVar1->rules).super__Deque_base<EOPlus::Rule,_std::allocator<EOPlus::Rule>_>._M_impl.
     super__Deque_impl_data._M_finish._M_cur != pRVar2)) {
    lVar3 = ((long)pRVar2 -
             (long)(pSVar1->rules).super__Deque_base<EOPlus::Rule,_std::allocator<EOPlus::Rule>_>.
                   _M_impl.super__Deque_impl_data._M_start._M_first >> 3) * 0x7e3f1f8fc7e3f1f9 +
            pSVar1->goal_rule;
    if (lVar3 != 0) {
      return (pSVar1->rules).super__Deque_base<EOPlus::Rule,_std::allocator<EOPlus::Rule>_>._M_impl.
             super__Deque_impl_data._M_start._M_node[lVar3];
    }
    return pRVar2 + pSVar1->goal_rule;
  }
  return (Rule *)0x0;
}

Assistant:

const Rule* Context::GetGoal() const
	{
		if (!this->state || this->state->rules.empty())
			return 0;

		return &this->state->rules[this->state->goal_rule];
	}